

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O1

TreeOrError * __thiscall
slang::syntax::SyntaxTree::fromFiles
          (TreeOrError *__return_storage_ptr__,SyntaxTree *this,
          span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
          paths,SourceManager *sourceManager,Bag *options)

{
  path *this_00;
  char *pcVar1;
  bool bVar2;
  undefined8 uVar3;
  pointer pbVar4;
  long lVar5;
  span<const_slang::SourceBuffer,_18446744073709551615UL> sources;
  MacroList inheritedMacros;
  basic_string_view<char,_std::char_traits<char>_> path;
  BufferOrError buffer;
  SmallVector<slang::SourceBuffer,_4UL> buffers;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  undefined1 local_138 [56];
  pthread_rwlock_t pStack_100;
  SmallVector<slang::SourceBuffer,_4UL> local_c8;
  
  pbVar4 = paths._M_ptr;
  SmallVector<slang::SourceBuffer,_4UL>::SmallVector(&local_c8,pbVar4);
  if (pbVar4 != (pointer)0x0) {
    bVar2 = (__return_storage_ptr__->contained).
            super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
            .m_has_value;
    lVar5 = 0;
    this_00 = (path *)(local_138 + 0x30);
    do {
      pcVar1 = (this->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
               super_SmallVectorBase<slang::Diagnostic>.firstElement + lVar5 + -0x48;
      local_148._M_len = *(size_t *)pcVar1;
      local_148._M_str = *(char **)(pcVar1 + 8);
      std::filesystem::__cxx11::path::
      path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
                (this_00,&local_148,auto_format);
      SourceManager::readSource
                ((BufferOrError *)local_138,
                 (SourceManager *)paths._M_extent._M_extent_value._M_extent_value,this_00,
                 (SourceLibrary *)0x0,0xffffffffffffffff);
      std::filesystem::__cxx11::path::~path(this_00);
      if ((bool)local_138[0x20] == false) {
        local_138._48_8_ = local_138._0_8_;
        pStack_100.__align = local_138._8_8_;
        pStack_100._8_8_ = local_148._M_len;
        pStack_100._16_8_ = local_148._M_str;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        .field_0.m_error.second._M_len = local_148._M_len;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        .field_0.m_error.second._M_str = local_148._M_str;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_138._0_8_;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        .m_has_value = false;
        goto LAB_00147beb;
      }
      SmallVectorBase<slang::SourceBuffer>::emplace_back<slang::SourceBuffer_const&>
                (&local_c8.super_SmallVectorBase<slang::SourceBuffer>,(SourceBuffer *)local_138);
      lVar5 = lVar5 + 0x10;
    } while ((long)pbVar4 << 4 != lVar5);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    .m_has_value = bVar2;
  }
  pStack_100.__data.__pad2 = 0;
  pStack_100._48_8_ = 0;
  sources._M_extent._M_extent_value =
       (size_t)local_c8.super_SmallVectorBase<slang::SourceBuffer>.data_;
  sources._M_ptr = (pointer)paths._M_extent._M_extent_value._M_extent_value;
  inheritedMacros._M_extent._M_extent_value = 0;
  inheritedMacros._M_ptr = (pointer)sourceManager;
  create((SourceManager *)local_138,sources,
         (Bag *)local_c8.super_SmallVectorBase<slang::SourceBuffer>.len,inheritedMacros,false);
  uVar3 = local_138._8_8_;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  .m_has_value = true;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)local_138._0_8_;
  (__return_storage_ptr__->contained).
  super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
LAB_00147beb:
  if (local_c8.super_SmallVectorBase<slang::SourceBuffer>.data_ !=
      (pointer)local_c8.super_SmallVectorBase<slang::SourceBuffer>.firstElement) {
    operator_delete(local_c8.super_SmallVectorBase<slang::SourceBuffer>.data_);
  }
  return __return_storage_ptr__;
}

Assistant:

SyntaxTree::TreeOrError SyntaxTree::fromFiles(std::span<const std::string_view> paths,
                                              SourceManager& sourceManager, const Bag& options) {
    SmallVector<SourceBuffer, 4> buffers(paths.size(), UninitializedTag());
    for (auto path : paths) {
        auto buffer = sourceManager.readSource(path, /* library */ nullptr);
        if (!buffer)
            return nonstd::make_unexpected(std::pair{buffer.error(), path});

        buffers.push_back(*buffer);
    }

    return create(sourceManager, buffers, options, {}, false);
}